

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.cpp
# Opt level: O0

string * anon_unknown.dwarf_29c37::skipUntilRegex(ifstream *fileStream,regex *regExp)

{
  bool bVar1;
  istream *in_RSI;
  string *in_RDI;
  string *curString;
  string *__e;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffd0;
  
  __e = in_RDI;
  std::__cxx11::string::string((string *)in_RDI);
  do {
    std::getline<char,std::char_traits<char>,std::allocator<char>>(in_RSI,(string *)in_RDI);
    bVar1 = std::
            regex_search<std::char_traits<char>,std::allocator<char>,char,std::__cxx11::regex_traits<char>>
                      (in_stack_ffffffffffffffd0,
                       (basic_regex<char,_std::__cxx11::regex_traits<char>_> *)__e,
                       (match_flag_type)((ulong)in_RDI >> 0x20));
  } while (((bVar1 ^ 0xffU) & 1) != 0);
  return __e;
}

Assistant:

string skipUntilRegex(ifstream & fileStream, const regex & regExp) {
        string curString;
        do {
            getline(fileStream, curString);
        } while ( ! regex_search(curString, regExp));
        return curString;
    }